

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_negate(secp256k1_scalar *r,secp256k1_scalar *a)

{
  int iVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong *in_RSI;
  ulong *in_RDI;
  secp256k1_uint128 t;
  uint64_t nonzero;
  uint in_stack_ffffffffffffffdc;
  secp256k1_uint128 *in_stack_ffffffffffffffe0;
  
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x1034e8);
  uVar2 = -(long)(int)(uint)(iVar1 == 0);
  secp256k1_scalar_verify((secp256k1_scalar *)0x103508);
  secp256k1_u128_from_u64
            ((secp256k1_uint128 *)&stack0xffffffffffffffd8,*in_RSI ^ 0xffffffffffffffff);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8,0xbfd25e8cd0364142);
  uVar3 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8);
  *in_RDI = uVar3 & uVar2;
  secp256k1_u128_rshift(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  secp256k1_u128_accum_u64
            ((secp256k1_uint128 *)&stack0xffffffffffffffd8,in_RSI[1] ^ 0xffffffffffffffff);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8,0xbaaedce6af48a03b);
  uVar3 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8);
  in_RDI[1] = uVar3 & uVar2;
  secp256k1_u128_rshift(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  secp256k1_u128_accum_u64
            ((secp256k1_uint128 *)&stack0xffffffffffffffd8,in_RSI[2] ^ 0xffffffffffffffff);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8,0xfffffffffffffffe);
  uVar3 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8);
  in_RDI[2] = uVar3 & uVar2;
  secp256k1_u128_rshift(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  secp256k1_u128_accum_u64
            ((secp256k1_uint128 *)&stack0xffffffffffffffd8,in_RSI[3] ^ 0xffffffffffffffff);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8,0xffffffffffffffff);
  uVar3 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8);
  in_RDI[3] = uVar3 & uVar2;
  secp256k1_scalar_verify((secp256k1_scalar *)0x103631);
  return;
}

Assistant:

static void secp256k1_scalar_negate(secp256k1_scalar *r, const secp256k1_scalar *a) {
    uint64_t nonzero = 0xFFFFFFFFFFFFFFFFULL * (secp256k1_scalar_is_zero(a) == 0);
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(a);

    secp256k1_u128_from_u64(&t, ~a->d[0]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_0 + 1);
    r->d[0] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[1]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_1);
    r->d[1] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[2]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_2);
    r->d[2] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[3]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_3);
    r->d[3] = secp256k1_u128_to_u64(&t) & nonzero;

    SECP256K1_SCALAR_VERIFY(r);
}